

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool picojson::
     _parse_object<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (default_parse_context *ctx,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar3 = default_parse_context::parse_object_start(ctx);
  if (bVar3) {
    bVar3 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::expect(in,0x7d);
    bVar4 = true;
    if (!bVar3) {
      do {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        bVar3 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x22);
LAB_00108662:
        if (bVar3 != false) {
          do {
            pbVar5 = (byte *)(in->cur_)._M_current;
            if (in->consumed_ == true) {
              if (*pbVar5 == 10) {
                in->line_ = in->line_ + 1;
              }
              pbVar5 = pbVar5 + 1;
              (in->cur_)._M_current = (char *)pbVar5;
            }
            pbVar2 = (byte *)(in->end_)._M_current;
            if (pbVar5 == pbVar2) {
LAB_00108725:
              in->consumed_ = false;
              break;
            }
            in->consumed_ = true;
            bVar1 = *pbVar5;
            if (bVar1 < 0x20) goto LAB_00108725;
            if (bVar1 == 0x5c) {
              pbVar5 = pbVar5 + 1;
              (in->cur_)._M_current = (char *)pbVar5;
              if (pbVar5 == pbVar2) goto LAB_00108725;
              in->consumed_ = true;
              bVar1 = *pbVar5;
              bVar3 = false;
              if (bVar1 < 0x62) {
                if (((bVar1 != 0x22) && (bVar1 != 0x2f)) && (bVar1 != 0x5c))
                goto switchD_001086f5_caseD_6f;
              }
              else {
                bVar3 = false;
                switch(bVar1) {
                case 0x6e:
                  break;
                case 0x6f:
                case 0x70:
                case 0x71:
                case 0x73:
                  goto switchD_001086f5_caseD_6f;
                case 0x72:
                  break;
                case 0x74:
                  break;
                case 0x75:
                  goto switchD_001086f5_caseD_75;
                default:
                  if ((bVar1 != 0x66) && (bVar1 != 0x62)) goto switchD_001086f5_caseD_6f;
                }
              }
            }
            else if (bVar1 == 0x22) {
              bVar3 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::expect(in,0x3a);
              if (!bVar3) break;
              bVar3 = default_parse_context::
                      parse_object_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                (ctx,in,&local_50);
              goto switchD_001086f5_caseD_6f;
            }
            std::__cxx11::string::push_back((char)&local_50);
          } while( true );
        }
        bVar3 = false;
switchD_001086f5_caseD_6f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
        if (bVar3 == false) goto LAB_00108781;
        bVar3 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x2c);
        if (!bVar3) {
          bVar3 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::expect(in,0x7d);
          return bVar3;
        }
      } while( true );
    }
  }
  else {
LAB_00108781:
    bVar4 = false;
  }
  return bVar4;
switchD_001086f5_caseD_75:
  bVar3 = _parse_codepoint<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&local_50,in);
  goto LAB_00108662;
}

Assistant:

inline bool _parse_object(Context &ctx, input<Iter> &in) {
  if (!ctx.parse_object_start()) {
    return false;
  }
  if (in.expect('}')) {
    return true;
  }
  do {
    std::string key;
    if (!in.expect('"') || !_parse_string(key, in) || !in.expect(':')) {
      return false;
    }
    if (!ctx.parse_object_item(in, key)) {
      return false;
    }
  } while (in.expect(','));
  return in.expect('}');
}